

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ListColumnData::UpdateColumn
          (ListColumnData *this,TransactionData transaction,vector<unsigned_long,_true> *column_path
          ,Vector *update_vector,row_t *row_ids,idx_t update_count,idx_t depth)

{
  NotImplementedException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"List Update Column is not supported",&local_39);
  NotImplementedException::NotImplementedException(this_00,&local_38);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ListColumnData::UpdateColumn(TransactionData transaction, const vector<column_t> &column_path,
                                  Vector &update_vector, row_t *row_ids, idx_t update_count, idx_t depth) {
	throw NotImplementedException("List Update Column is not supported");
}